

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O1

int cmime_message_add_child_part
              (CMimeMessage_T *message,CMimePart_T *part,CMimePart_T *child,
              CMimeMultipartType_T subtype)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  CMimeListElem_T *elem;
  char *local_40;
  char *s;
  char *content_type;
  
  s = (char *)0x0;
  local_40 = (char *)0x0;
  if (message == (CMimeMessage_T *)0x0) {
    __assert_fail("message",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x4e4,
                  "int cmime_message_add_child_part(CMimeMessage_T *, CMimePart_T *, CMimePart_T *, CMimeMultipartType_T)"
                 );
  }
  if (part != (CMimePart_T *)0x0) {
    if (child == (CMimePart_T *)0x0) {
      __assert_fail("child",
                    "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                    ,0x4e6,
                    "int cmime_message_add_child_part(CMimeMessage_T *, CMimePart_T *, CMimePart_T *, CMimeMultipartType_T)"
                   );
    }
    elem = message->parts->head;
    while( true ) {
      if (elem == (CMimeListElem_T *)0x0) {
        return -1;
      }
      if (((CMimePart_T *)elem->data == part) && (part->boundary == (char *)0x0)) break;
      elem = elem->next;
    }
    pcVar2 = "\r\n";
    if (message->linebreak != (char *)0x0) {
      pcVar2 = message->linebreak;
    }
    if (subtype < CMIME_MULTIPART_RELATED) {
      pcVar5 = &DAT_0010fe64 + *(int *)(&DAT_0010fe64 + (ulong)subtype * 4);
    }
    else {
      pcVar5 = "multipart/mixed;%s\t";
    }
    asprintf(&s,pcVar5,pcVar2);
    pcVar2 = cmime_message_generate_boundary();
    asprintf(&local_40,"boundary=\"%s\"",pcVar2);
    part->boundary = pcVar2;
    pcVar5 = strdup(pcVar2);
    pcVar2 = s;
    child->parent_boundary = pcVar5;
    sVar3 = strlen(s);
    sVar4 = strlen(local_40);
    s = (char *)realloc(pcVar2,sVar3 + sVar4 + 1);
    pcVar2 = local_40;
    strcat(s,local_40);
    free(pcVar2);
    if (part->last == 1) {
      part->last = 0;
      child->last = 1;
    }
    cmime_part_set_content_type(part,s);
    free(s);
    iVar1 = cmime_list_insert_next(message->parts,elem,child);
    return -(uint)(iVar1 != 0);
  }
  __assert_fail("part",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                ,0x4e5,
                "int cmime_message_add_child_part(CMimeMessage_T *, CMimePart_T *, CMimePart_T *, CMimeMultipartType_T)"
               );
}

Assistant:

int cmime_message_add_child_part(CMimeMessage_T *message, CMimePart_T *part, CMimePart_T *child, CMimeMultipartType_T subtype) {
    CMimeListElem_T *elem = NULL;
    CMimePart_T *current_part = NULL;
    char *boundary = NULL;
    char *content_type = NULL;
    char *nl = NULL;
    char *s = NULL;

    assert(message);
    assert(part);
    assert(child);

    elem = cmime_list_head(message->parts);
    while(elem != NULL) {
        current_part = cmime_list_data(elem);
        if (current_part == part) {
            /* add a boundary, if not present */
            if (part->boundary == NULL) {
                if (message->linebreak)
                    nl = message->linebreak;
                else
                    nl = CRLF;

                switch(subtype) {
                    case CMIME_MULTIPART_MIXED:
                        asprintf(&content_type,"multipart/mixed;%s\t",nl);
                        break;
                    case CMIME_MULTIPART_DIGEST:
                        asprintf(&content_type,"multipart/digest;%s\t",nl);
                        break;
                    case CMIME_MULTIPART_ALTERNATIVE:
                        asprintf(&content_type,"multipart/alternative;%s\t",nl);
                        break;
                    case CMIME_MULTIPART_MESSAGE:
                        asprintf(&content_type,"message/rfc822;%s\t",nl);
                        break;
                    default:
                        asprintf(&content_type,"multipart/mixed;%s\t",nl);
                        break;
                }

                boundary = cmime_message_generate_boundary();
                asprintf(&s,"boundary=\"%s\"",boundary);
                part->boundary = boundary;
                child->parent_boundary = strdup(boundary);

                content_type = (char *)realloc(content_type,strlen(content_type) + strlen(s) + sizeof(char));
                strcat(content_type,s);
                free(s);
                if (part->last == 1) {
                    part->last = 0;
                    child->last = 1;
                }

                cmime_part_set_content_type(part, content_type);
                free(content_type);
                if (cmime_list_insert_next(message->parts,elem,child)!=0)
                    return(-1);
                
                return(0);
            }
        }
        elem = elem->next;
    }

    return(-1);
}